

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O0

void lrit::to_json(json *j,TimeStampHeader *h)

{
  initializer_list_t init;
  size_t sVar1;
  pointer pvVar2;
  size_type __maxsize;
  tm *__tp;
  size_t len;
  timespec ts;
  array<char,_128UL> tsbuf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffd10;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffd18;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffd20;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  in_stack_fffffffffffffd28;
  TimeStampHeader *in_stack_fffffffffffffd60;
  undefined1 **local_270;
  undefined8 in_stack_fffffffffffffd98;
  undefined2 uVar4;
  undefined8 **ppuVar3;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffda0;
  undefined8 **ppuVar5;
  iterator in_stack_fffffffffffffda8;
  size_type in_stack_fffffffffffffdb0;
  undefined1 **local_240;
  allocator local_1f1;
  string local_1f0 [32];
  undefined8 *local_1d0;
  undefined1 *local_1c8 [4];
  undefined1 local_1a8 [32];
  undefined8 *local_188;
  undefined8 local_180;
  undefined8 *local_168;
  undefined1 *local_160 [4];
  undefined1 local_140 [32];
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 *local_110;
  undefined1 *local_108 [4];
  undefined1 local_e8 [32];
  undefined8 *local_c8;
  undefined8 local_c0;
  size_t local_a8;
  timespec local_a0;
  array<char,_128UL> local_90;
  
  uVar4 = (undefined2)((ulong)in_stack_fffffffffffffd98 >> 0x30);
  local_a0 = TimeStampHeader::getUnix(in_stack_fffffffffffffd60);
  pvVar2 = std::array<char,_128UL>::data((array<char,_128UL> *)0x2c5e79);
  __maxsize = std::array<char,_128UL>::size(&local_90);
  __tp = gmtime(&local_a0.tv_sec);
  local_a8 = strftime(pvVar2,__maxsize,"%Y-%m-%dT%H:%M:%SZ",__tp);
  local_110 = local_108;
  local_168 = local_160;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[5]>(in_stack_fffffffffffffd10,(char (*) [5])in_stack_fffffffffffffd08);
  local_168 = (undefined8 *)local_140;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<long_const&>(in_stack_fffffffffffffd10,(long *)in_stack_fffffffffffffd08);
  local_120 = local_160;
  local_118 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffd20,in_stack_fffffffffffffd28);
  local_110 = (undefined8 *)local_e8;
  local_1d0 = local_1c8;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[8]>(in_stack_fffffffffffffd10,(char (*) [8])in_stack_fffffffffffffd08);
  local_1d0 = (undefined8 *)local_1a8;
  pvVar2 = std::array<char,_128UL>::data((array<char,_128UL> *)0x2c5fbd);
  sVar1 = local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,pvVar2,sVar1,&local_1f1);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<std::__cxx11::string>(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  local_188 = local_1c8;
  local_180 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffd20,in_stack_fffffffffffffd28);
  local_c8 = local_108;
  local_c0 = 2;
  init._M_len = in_stack_fffffffffffffdb0;
  init._M_array = in_stack_fffffffffffffda8;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(in_stack_fffffffffffffda0,init,SUB21((ushort)uVar4 >> 8,0),(value_t)uVar4);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=(&in_stack_fffffffffffffd20->owned_value,in_stack_fffffffffffffd18);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&in_stack_fffffffffffffd10->owned_value);
  local_240 = (undefined1 **)&local_c8;
  do {
    local_240 = local_240 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x2c6110);
  } while (local_240 != local_108);
  ppuVar5 = (undefined8 **)local_1c8;
  ppuVar3 = &local_188;
  do {
    ppuVar3 = ppuVar3 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x2c6162);
  } while (ppuVar3 != ppuVar5);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  local_270 = (undefined1 **)&local_120;
  do {
    local_270 = local_270 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x2c61cb);
  } while (local_270 != local_160);
  return;
}

Assistant:

void to_json(json& j, const TimeStampHeader& h) {
  std::array<char, 128> tsbuf;
  const auto ts = h.getUnix();
  const auto len = strftime(
      tsbuf.data(), tsbuf.size(), "%Y-%m-%dT%H:%M:%SZ", gmtime(&ts.tv_sec));
  j = {
      {"Unix", ts.tv_sec},
      {"ISO8601", std::string(tsbuf.data(), len)},
  };
}